

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Rep *pRVar5;
  RepeatedPtrFieldBase *pRVar6;
  string *psVar7;
  ulong uVar8;
  undefined8 unaff_RBX;
  undefined1 *puVar9;
  RepeatedPtrFieldBase *this_00;
  undefined8 unaff_R14;
  undefined1 auStack_30 [16];
  code *pcStack_20;
  undefined1 auStack_18 [8];
  
  puVar9 = auStack_18;
  if (this->tagged_rep_or_elem_ != (void *)0x0) {
    pcStack_20 = (code *)0x1c0db9;
    Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
    return;
  }
  this_00 = (RepeatedPtrFieldBase *)&stack0xfffffffffffffff0;
  pcStack_20 = Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>;
  Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(this_00);
  uVar1 = this_00->current_size_;
  if ((int)uVar1 < 0) {
    puVar9 = auStack_30;
    this_00 = (RepeatedPtrFieldBase *)(ulong)uVar1;
    Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
  }
  else if (uVar1 == 0) {
    return;
  }
  *(undefined8 *)(puVar9 + -8) = unaff_R14;
  *(undefined8 *)(puVar9 + -0x10) = unaff_RBX;
  uVar1 = this_00->current_size_;
  pRVar6 = this_00;
  if (((ulong)this_00->tagged_rep_or_elem_ & 1) != 0) {
    *(undefined8 *)(puVar9 + -0x30) = 0x1c0e04;
    pRVar5 = rep(this_00);
    pRVar6 = (RepeatedPtrFieldBase *)pRVar5->elements;
  }
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      puVar2 = (undefined8 *)(&pRVar6->tagged_rep_or_elem_)[uVar8];
      uVar8 = uVar8 + 1;
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    } while (uVar1 != uVar8);
    this_00->current_size_ = 0;
    return;
  }
  *(undefined8 *)(puVar9 + -0x30) = 0x1c0e49;
  psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                     ((long)(int)uVar1,0,"n > 0");
  uVar3 = *(undefined8 *)psVar7;
  uVar4 = *(undefined8 *)(psVar7 + 8);
  *(undefined8 *)(puVar9 + -0x30) = 0x1c0e69;
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)(puVar9 + -0x20),
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,0x2a8,uVar4,uVar3);
  *(undefined8 *)(puVar9 + -0x30) = 0x1c0e71;
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)(puVar9 + -0x20));
}

Assistant:

void Destroy() {
    ABSL_DCHECK(NeedsDestroy());

    // TODO: arena check is redundant once all `RepeatedPtrField`s
    // with non-null arena are owned by the arena.
    if (PROTOBUF_PREDICT_FALSE(arena_ != nullptr)) return;

    using H = CommonHandler<TypeHandler>;
    int n = allocated_size();
    void** elems = elements();
    for (int i = 0; i < n; i++) {
      Delete<H>(elems[i], nullptr);
    }
    if (!using_sso()) {
      internal::SizedDelete(rep(),
                            Capacity() * sizeof(elems[0]) + kRepHeaderSize);
    }
  }